

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O0

Action<test_result_(unsigned_long_long)> __thiscall
testing::internal::ReturnAction::operator_cast_to_Action(ReturnAction<test_result> *this)

{
  linked_ptr_internal extraout_RDX;
  Action<test_result_(unsigned_long_long)> *in_RDI;
  Action<test_result_(unsigned_long_long)> AVar1;
  ActionInterface<test_result_(unsigned_long_long)> *in_stack_ffffffffffffffb8;
  Action<test_result_(unsigned_long_long)> *this_00;
  
  this_00 = in_RDI;
  operator_new(0x10);
  ReturnAction<test_result>::Impl<test_result_(unsigned_long_long)>::Impl();
  Action<test_result_(unsigned_long_long)>::Action(this_00,in_stack_ffffffffffffffb8);
  AVar1.impl_.link_.next_ = extraout_RDX.next_;
  AVar1.impl_.value_ = (ActionInterface<test_result_(unsigned_long_long)> *)in_RDI;
  return (Action<test_result_(unsigned_long_long)>)AVar1.impl_;
}

Assistant:

operator Action<F>() const {
    // Assert statement belongs here because this is the best place to verify
    // conditions on F. It produces the clearest error messages
    // in most compilers.
    // Impl really belongs in this scope as a local class but can't
    // because MSVC produces duplicate symbols in different translation units
    // in this case. Until MS fixes that bug we put Impl into the class scope
    // and put the typedef both here (for use in assert statement) and
    // in the Impl class. But both definitions must be the same.
    typedef typename Function<F>::Result Result;
    GTEST_COMPILE_ASSERT_(
        !internal::is_reference<Result>::value,
        use_ReturnRef_instead_of_Return_to_return_a_reference);
    return Action<F>(new Impl<F>(value_));
  }